

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

string * __thiscall
t_d_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *type,t_const_value *value)

{
  __type _Var1;
  bool bVar2;
  uint uVar3;
  t_const_value_type tVar4;
  int iVar5;
  t_struct *this_00;
  int64_t iVar6;
  ostream *poVar7;
  reference pptVar8;
  string *__lhs;
  undefined4 extraout_var;
  t_type *type_00;
  pointer ppVar9;
  t_type *ptVar10;
  reference pptVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  undefined4 extraout_var_00;
  char *pcVar13;
  double dVar14;
  undefined1 auVar15 [12];
  undefined1 local_4a8 [8];
  string val_7;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_478;
  const_iterator v_iter_3;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_6;
  t_type *etype_1;
  string val_5;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_430;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_4;
  t_type *etype;
  undefined1 local_3f8 [8];
  string val_3;
  string key;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_3a8;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_2;
  t_type *vtype;
  t_type *ktype;
  undefined1 local_368 [8];
  string val_1;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_2c0
  ;
  t_field **local_2b8;
  t_type *local_2b0;
  t_type *field_type;
  _Base_ptr local_2a0;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_298;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_258;
  string local_238;
  undefined1 local_211;
  string local_210;
  string local_1f0;
  string local_1d0;
  t_base local_1b0;
  t_base tbase;
  undefined1 local_1a0 [8];
  ostringstream out;
  t_const_value *value_local;
  t_type *type_local;
  t_d_generator *this_local;
  
  out._368_8_ = value;
  this_00 = (t_struct *)t_generator::get_true_type(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar3 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)local_1a0,"{");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
      render_type_name_abi_cxx11_(&local_258,this,(t_type *)this_00,false);
      poVar7 = std::operator<<(poVar7,(string *)&local_258);
      poVar7 = std::operator<<(poVar7," v;");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_258);
      uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if (((uVar3 & 1) == 0) &&
         (uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
        uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar3 & 1) == 0) {
          uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])();
            if ((uVar3 & 1) == 0) {
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
              std::operator+(pbVar12,"Compiler error: Invalid type in render_const_value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar5));
              __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar10 = t_set::get_elem_type((t_set *)this_00);
            v_iter_3._M_current =
                 (t_const_value **)t_const_value::get_list((t_const_value *)out._368_8_);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::__normal_iterator(&local_478);
            local_478._M_current =
                 (t_const_value **)
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                           (v_iter_3._M_current);
            while( true ) {
              val_7.field_2._8_8_ =
                   std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                             ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                              v_iter_3._M_current);
              bVar2 = __gnu_cxx::operator!=
                                (&local_478,
                                 (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  *)((long)&val_7.field_2 + 8));
              if (!bVar2) break;
              pptVar11 = __gnu_cxx::
                         __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                         ::operator*(&local_478);
              render_const_value_abi_cxx11_((string *)local_4a8,this,ptVar10,*pptVar11);
              poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
              poVar7 = std::operator<<(poVar7,"v ~= ");
              poVar7 = std::operator<<(poVar7,(string *)local_4a8);
              poVar7 = std::operator<<(poVar7,";");
              std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)local_4a8);
              __gnu_cxx::
              __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
              ::operator++(&local_478);
            }
          }
          else {
            ptVar10 = t_list::get_elem_type((t_list *)this_00);
            v_iter_2._M_current =
                 (t_const_value **)t_const_value::get_list((t_const_value *)out._368_8_);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::__normal_iterator(&local_430);
            local_430._M_current =
                 (t_const_value **)
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                           (v_iter_2._M_current);
            while( true ) {
              val_5.field_2._8_8_ =
                   std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                             ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                              v_iter_2._M_current);
              bVar2 = __gnu_cxx::operator!=
                                (&local_430,
                                 (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  *)((long)&val_5.field_2 + 8));
              if (!bVar2) break;
              pptVar11 = __gnu_cxx::
                         __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                         ::operator*(&local_430);
              render_const_value_abi_cxx11_((string *)&etype_1,this,ptVar10,*pptVar11);
              poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
              poVar7 = std::operator<<(poVar7,"v ~= ");
              poVar7 = std::operator<<(poVar7,(string *)&etype_1);
              poVar7 = std::operator<<(poVar7,";");
              std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)&etype_1);
              __gnu_cxx::
              __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
              ::operator++(&local_430);
            }
          }
        }
        else {
          ptVar10 = t_map::get_key_type((t_map *)this_00);
          type_00 = t_map::get_val_type((t_map *)this_00);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)out._368_8_);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_3a8);
          local_3a8._M_node =
               (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::begin(v_iter_1._M_node);
          while( true ) {
            key.field_2._8_8_ =
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)v_iter_1._M_node);
            bVar2 = std::operator!=(&local_3a8,(_Self *)((long)&key.field_2 + 8));
            if (!bVar2) break;
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_3a8);
            render_const_value_abi_cxx11_
                      ((string *)((long)&val_3.field_2 + 8),this,ptVar10,ppVar9->first);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_3a8);
            render_const_value_abi_cxx11_((string *)local_3f8,this,type_00,ppVar9->second);
            poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
            std::operator<<(poVar7,"v[");
            bVar2 = is_immutable_type(this,ptVar10);
            if (!bVar2) {
              poVar7 = std::operator<<((ostream *)local_1a0,"cast(immutable(");
              render_type_name_abi_cxx11_((string *)&etype,this,ptVar10,false);
              poVar7 = std::operator<<(poVar7,(string *)&etype);
              std::operator<<(poVar7,"))");
              std::__cxx11::string::~string((string *)&etype);
            }
            poVar7 = std::operator<<((ostream *)local_1a0,(string *)(val_3.field_2._M_local_buf + 8)
                                    );
            poVar7 = std::operator<<(poVar7,"] = ");
            poVar7 = std::operator<<(poVar7,(string *)local_3f8);
            poVar7 = std::operator<<(poVar7,";");
            std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_3f8);
            std::__cxx11::string::~string((string *)(val_3.field_2._M_local_buf + 8));
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_3a8);
          }
        }
      }
      else {
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
        poVar7 = std::operator<<(poVar7,"v = ");
        uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])();
        pcVar13 = "";
        if ((uVar3 & 1) != 0) {
          pcVar13 = "new ";
        }
        poVar7 = std::operator<<(poVar7,pcVar13);
        render_type_name_abi_cxx11_((string *)&fields,this,(t_type *)this_00,false);
        poVar7 = std::operator<<(poVar7,(string *)&fields);
        poVar7 = std::operator<<(poVar7,"();");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&fields);
        f_iter._M_current = (t_field **)t_struct::get_members(this_00);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)out._368_8_);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&local_298);
        local_2a0 = (_Base_ptr)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::begin(v_iter._M_node);
        local_298._M_node = local_2a0;
        while( true ) {
          field_type = (t_type *)
                       std::
                       map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              *)v_iter._M_node);
          bVar2 = std::operator!=(&local_298,(_Self *)&field_type);
          if (!bVar2) break;
          local_2b0 = (t_type *)0x0;
          local_2b8 = (t_field **)
                      std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
          val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_2b8;
          while( true ) {
            local_2c0._M_current =
                 (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val,&local_2c0);
            ptVar10 = local_2b0;
            if (!bVar2) break;
            pptVar8 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                   *)&val);
            __lhs = t_field::get_name_abi_cxx11_(*pptVar8);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_298);
            t_const_value::get_string_abi_cxx11_(&local_2e0,ppVar9->first);
            _Var1 = std::operator==(__lhs,&local_2e0);
            std::__cxx11::string::~string((string *)&local_2e0);
            if (_Var1) {
              pptVar8 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              local_2b0 = t_field::get_type(*pptVar8);
            }
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&val);
          }
          if (local_2b0 == (t_type *)0x0) {
            val_1.field_2._M_local_buf[0xf] = '\x01';
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
            std::operator+(&local_320,"Type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar5));
            std::operator+(&local_300,&local_320," has no field ");
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_298);
            t_const_value::get_string_abi_cxx11_(&local_340,ppVar9->first);
            std::operator+(pbVar12,&local_300,&local_340);
            val_1.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&local_298);
          render_const_value_abi_cxx11_((string *)local_368,this,ptVar10,ppVar9->second);
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
          poVar7 = std::operator<<(poVar7,"v.set!`");
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&local_298);
          t_const_value::get_string_abi_cxx11_((string *)&ktype,ppVar9->first);
          poVar7 = std::operator<<(poVar7,(string *)&ktype);
          poVar7 = std::operator<<(poVar7,"`(");
          poVar7 = std::operator<<(poVar7,(string *)local_368);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&ktype);
          std::__cxx11::string::~string((string *)local_368);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          operator++(&local_298);
        }
      }
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
      poVar7 = std::operator<<(poVar7,"return v;");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
      std::operator<<(poVar7,"}()");
    }
    else {
      poVar7 = std::operator<<((ostream *)local_1a0,"cast(");
      render_type_name_abi_cxx11_(&local_238,this,(t_type *)this_00,false);
      poVar7 = std::operator<<(poVar7,(string *)&local_238);
      poVar7 = std::operator<<(poVar7,")");
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(poVar7,iVar6);
      std::__cxx11::string::~string((string *)&local_238);
    }
  }
  else {
    local_1b0 = t_base_type::get_base((t_base_type *)this_00);
    switch(local_1b0) {
    case TYPE_STRING:
      poVar7 = std::operator<<((ostream *)local_1a0,'\"');
      t_generator::get_escaped_string_abi_cxx11_
                (&local_1d0,(t_generator *)this,(t_const_value *)out._368_8_);
      poVar7 = std::operator<<(poVar7,(string *)&local_1d0);
      std::operator<<(poVar7,'\"');
      std::__cxx11::string::~string((string *)&local_1d0);
      break;
    case TYPE_BOOL:
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      pcVar13 = "false";
      if (0 < iVar6) {
        pcVar13 = "true";
      }
      std::operator<<((ostream *)local_1a0,pcVar13);
      break;
    case TYPE_I8:
    case TYPE_I16:
      poVar7 = std::operator<<((ostream *)local_1a0,"cast(");
      render_type_name_abi_cxx11_(&local_1f0,this,(t_type *)this_00,false);
      poVar7 = std::operator<<(poVar7,(string *)&local_1f0);
      poVar7 = std::operator<<(poVar7,")");
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(poVar7,iVar6);
      std::__cxx11::string::~string((string *)&local_1f0);
      break;
    case TYPE_I32:
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(local_1a0,iVar6);
      break;
    case TYPE_I64:
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      poVar7 = (ostream *)std::ostream::operator<<(local_1a0,iVar6);
      std::operator<<(poVar7,"L");
      break;
    case TYPE_DOUBLE:
      tVar4 = t_const_value::get_type((t_const_value *)out._368_8_);
      if (tVar4 == CV_INTEGER) {
        iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
        std::ostream::operator<<(local_1a0,iVar6);
      }
      else {
        dVar14 = t_const_value::get_double((t_const_value *)out._368_8_);
        std::ostream::operator<<(local_1a0,dVar14);
      }
      break;
    default:
      local_211 = 1;
      auVar15 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_210,(t_base_type *)(ulong)local_1b0,auVar15._8_4_);
      std::operator+(auVar15._0_8_,"Compiler error: No const of base type ",&local_210);
      local_211 = 0;
      __cxa_throw(auVar15._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string render_const_value(t_type* type, t_const_value* value) {
    // Resolve any typedefs.
    type = get_true_type(type);

    ostringstream out;
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_STRING:
        out << '"' << get_escaped_string(value) << '"';
        break;
      case t_base_type::TYPE_BOOL:
        out << ((value->get_integer() > 0) ? "true" : "false");
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
        out << "cast(" << render_type_name(type) << ")" << value->get_integer();
        break;
      case t_base_type::TYPE_I32:
        out << value->get_integer();
        break;
      case t_base_type::TYPE_I64:
        out << value->get_integer() << "L";
        break;
      case t_base_type::TYPE_DOUBLE:
        if (value->get_type() == t_const_value::CV_INTEGER) {
          out << value->get_integer();
        } else {
          out << value->get_double();
        }
        break;
      default:
        throw "Compiler error: No const of base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "cast(" << render_type_name(type) << ")" << value->get_integer();
    } else {
      out << "{" << endl;
      indent_up();

      indent(out) << render_type_name(type) << " v;" << endl;
      if (type->is_struct() || type->is_xception()) {
        indent(out) << "v = " << (type->is_xception() ? "new " : "") << render_type_name(type)
                    << "();" << endl;

        const vector<t_field*>& fields = ((t_struct*)type)->get_members();
        vector<t_field*>::const_iterator f_iter;
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          t_type* field_type = nullptr;
          for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
            if ((*f_iter)->get_name() == v_iter->first->get_string()) {
              field_type = (*f_iter)->get_type();
            }
          }
          if (field_type == nullptr) {
            throw "Type error: " + type->get_name() + " has no field "
                + v_iter->first->get_string();
          }
          string val = render_const_value(field_type, v_iter->second);
          indent(out) << "v.set!`" << v_iter->first->get_string() << "`(" << val << ");" << endl;
        }
      } else if (type->is_map()) {
        t_type* ktype = ((t_map*)type)->get_key_type();
        t_type* vtype = ((t_map*)type)->get_val_type();
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string key = render_const_value(ktype, v_iter->first);
          string val = render_const_value(vtype, v_iter->second);
          indent(out) << "v[";
          if (!is_immutable_type(ktype)) {
            out << "cast(immutable(" << render_type_name(ktype) << "))";
          }
          out << key << "] = " << val << ";" << endl;
        }
      } else if (type->is_list()) {
        t_type* etype = ((t_list*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else if (type->is_set()) {
        t_type* etype = ((t_set*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else {
        throw "Compiler error: Invalid type in render_const_value: " + type->get_name();
      }
      indent(out) << "return v;" << endl;

      indent_down();
      indent(out) << "}()";
    }

    return out.str();
  }